

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

void Internal_SplitFaceSwapFacePtr(ON_SubDFace *f,ON__UINT_PTR *pairA,ON__UINT_PTR *pairB)

{
  ulong uVar1;
  ON_SubDVertex *pOVar2;
  ON__UINT_PTR x_1;
  unsigned_short vfi;
  ON_SubDVertex *v;
  ON__UINT_PTR d;
  ON__UINT_PTR x;
  ulong *puStack_40;
  unsigned_short efi;
  ON_SubDFacePtr *efptr;
  ON_SubDEdge *fe;
  ON_SubDEdgePtr *pOStack_28;
  unsigned_short fei;
  ON_SubDEdgePtr *feptr;
  ON__UINT_PTR *pairB_local;
  ON__UINT_PTR *pairA_local;
  ON_SubDFace *f_local;
  
  if (f != (ON_SubDFace *)0x0) {
    if ((((*pairA == *pairB) || (pairA[1] == *pairB)) || (*pairA == pairB[1])) ||
       (pairA[1] == pairB[1])) {
      ON_SubDIncrementErrorCount();
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd.cpp"
                 ,0x47d2,"","pairA[] and pairB[] must be disjoint sets of values.");
    }
    else {
      pOStack_28 = f->m_edge4;
      fe._6_2_ = 0;
      while ((fe._6_2_ < f->m_edge_count &&
             ((fe._6_2_ != 4 || (pOStack_28 = f->m_edgex, pOStack_28 != (ON_SubDEdgePtr *)0x0))))) {
        uVar1 = pOStack_28->m_ptr & 0xfffffffffffffff8;
        if (uVar1 != 0) {
          puStack_40 = (ulong *)(uVar1 + 0x68);
          x._6_2_ = 0;
          while ((x._6_2_ < *(ushort *)(uVar1 + 100) &&
                 ((x._6_2_ != 2 ||
                  (puStack_40 = *(ulong **)(uVar1 + 0x78), puStack_40 != (ulong *)0x0))))) {
            if ((*puStack_40 & 0xfffffffffffffff8) == *pairA) {
              *puStack_40 = pairA[1] | *puStack_40 & 1;
            }
            else if ((*puStack_40 & 0xfffffffffffffff8) == *pairB) {
              *puStack_40 = pairB[1] | *puStack_40 & 1;
            }
            x._6_2_ = x._6_2_ + 1;
            puStack_40 = puStack_40 + 1;
          }
          pOVar2 = ON_SubDEdgePtr::RelativeVertex(pOStack_28,0);
          if ((pOVar2 != (ON_SubDVertex *)0x0) && (pOVar2->m_faces != (ON_SubDFace **)0x0)) {
            for (x_1._6_2_ = 0; x_1._6_2_ < pOVar2->m_face_count; x_1._6_2_ = x_1._6_2_ + 1) {
              if (pOVar2->m_faces[x_1._6_2_] == (ON_SubDFace *)*pairA) {
                pOVar2->m_faces[x_1._6_2_] = (ON_SubDFace *)pairA[1];
              }
              else if (pOVar2->m_faces[x_1._6_2_] == (ON_SubDFace *)*pairB) {
                pOVar2->m_faces[x_1._6_2_] = (ON_SubDFace *)pairB[1];
              }
            }
          }
        }
        fe._6_2_ = fe._6_2_ + 1;
        pOStack_28 = pOStack_28 + 1;
      }
    }
  }
  return;
}

Assistant:

static void Internal_SplitFaceSwapFacePtr(
  ON_SubDFace* f,
  ON__UINT_PTR pairA[2],
  ON__UINT_PTR pairB[2]
  )
{
  if (nullptr == f)
    return;

  if (pairA[0] == pairB[0] || pairA[1] == pairB[0] || pairA[0] == pairB[1] || pairA[1] == pairB[1])
  {
    ON_SUBD_ERROR("pairA[] and pairB[] must be disjoint sets of values.");
    return;
  }

  ON_SubDEdgePtr* feptr = f->m_edge4;
  for (unsigned short fei = 0; fei < f->m_edge_count; ++fei, ++feptr)
  {
    if (4 == fei)
    {
      feptr = f->m_edgex;
      if (nullptr == feptr)
        break;
    }

    ON_SubDEdge* fe = ON_SUBD_EDGE_POINTER(feptr->m_ptr);
    if (nullptr == fe)
      continue;

    ON_SubDFacePtr* efptr = fe->m_face2;
    for (unsigned short efi = 0; efi < fe->m_face_count; ++efi, ++efptr)
    {
      if (2 == efi)
      {
        efptr = fe->m_facex;
        if (nullptr == efptr)
          break;
      }
      const ON__UINT_PTR x = (efptr->m_ptr & ON_SUBD_COMPONENT_POINTER_MASK);
      const ON__UINT_PTR d = (efptr->m_ptr & ON_SUBD_COMPONENT_DIRECTION_MASK);
      if (x == pairA[0])
        efptr->m_ptr = (pairA[1] | d);
      else if (x == pairB[0])
        efptr->m_ptr = (pairB[1] | d);
    }


    ON_SubDVertex* v = const_cast<ON_SubDVertex*>(feptr->RelativeVertex(0));
    if (nullptr != v && nullptr != v->m_faces)
    {
      for (unsigned short vfi = 0; vfi < v->m_face_count; ++vfi)
      {
        const ON__UINT_PTR x = (ON__UINT_PTR)v->m_faces[vfi];
        if (x == pairA[0])
          v->m_faces[vfi] = (ON_SubDFace*)pairA[1];
        else if (x == pairB[0])
          v->m_faces[vfi] = (ON_SubDFace*)pairB[1];
      }
    }
  }
}